

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O3

bool __thiscall thread_pool::ThreadPool::TaskQueue::Pop(TaskQueue *this,function<void_()> *f)

{
  bool bVar1;
  function<void_()> *__x;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  __x = (this->queue).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  if ((this->queue).c.
      super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == __x) {
    do {
      if (this->is_done != false) {
        bVar1 = false;
        goto LAB_00115fd6;
      }
      std::condition_variable::wait((unique_lock *)&this->is_ready);
      __x = (this->queue).c.
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->queue).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur == __x);
  }
  std::function<void_()>::operator=(f,__x);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)this);
  bVar1 = true;
LAB_00115fd6:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar1;
}

Assistant:

bool Pop(std::function<void()>* f) {
      std::unique_lock<std::mutex> lock(mutex);
      while (queue.empty() && !is_done) {
        is_ready.wait(lock);
      }
      if (queue.empty()) {
        return false;
      }
      *f = std::move(queue.front());
      queue.pop();
      return true;
    }